

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steepestedgepricing.hpp
# Opt level: O1

void __thiscall
SteepestEdgePricing::update_weights
          (SteepestEdgePricing *this,QpVector *aq,QpVector *ep,HighsInt p,HighsInt q)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  pointer pdVar4;
  pointer pdVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  QpVector delta;
  QpVector QStack_58;
  
  uVar3 = (this->basis->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[p];
  Basis::ftran(&QStack_58,this->basis,aq,false,-1);
  if ((long)ep->num_nz < 1) {
    dVar9 = 0.0;
  }
  else {
    dVar9 = 0.0;
    lVar7 = 0;
    do {
      dVar1 = (ep->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start
              [(ep->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7]];
      dVar9 = dVar9 + dVar1 * dVar1;
      lVar7 = lVar7 + 1;
    } while (ep->num_nz != lVar7);
  }
  pdVar4 = (aq->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = pdVar4[(int)uVar3];
  uVar6 = (ulong)(this->runtime->instance).num_var;
  if (0 < (long)uVar6) {
    pdVar5 = (this->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      if (uVar3 != uVar8) {
        dVar2 = pdVar4[uVar8];
        pdVar5[uVar8] =
             ((dVar2 * dVar2) / (dVar1 * dVar1)) * dVar9 +
             (dVar2 / dVar1) * -2.0 *
             QStack_58.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar8] + pdVar5[uVar8];
      }
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  (this->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[(int)uVar3] = dVar9 / (dVar1 * dVar1);
  if (QStack_58.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(QStack_58.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (QStack_58.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(QStack_58.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void update_weights(const QpVector& aq, const QpVector& ep, HighsInt p,
                      HighsInt q) {
    HighsInt rowindex_p = basis.getindexinfactor()[p];
    // printf("Update weights, p = %d, rowindex = %d, q = %d\n", p, rowindex_p,
    // q);

    // if (!check_weights()) {
    //   printf("weight check failed\n");
    //   exit(1);
    // }

    QpVector delta = basis.ftran(aq);

    // double old_weight_p_updated = weights[rowindex_p];
    //  exact weight coming in needs to come in before update.
    double old_weight_p_computed = ep.dot(ep);

    // if (fabs(old_weight_p_computed - old_weight_p_updated) >= 1e-2) {
    //   printf("old weight[p] discrepancy: updated = %lf, computed=%lf\n",
    //   old_weight_p_updated, old_weight_p_computed);
    // }

    double weight_p = old_weight_p_computed;

    double t_p = aq.value[rowindex_p];
    for (HighsInt i = 0; i < runtime.instance.num_var; i++) {
      if (i != rowindex_p) {
        double t_i = aq.value[i];
        weights[i] = weights[i] - 2 * (t_i / t_p) * delta.value[i] +
                     ((t_i * t_i) / (t_p * t_p)) * weight_p;
        // printf("weights[%d] = %lf\n", i, weights[i]);
      }
    }
    // QpVector new_ep = basis.btran(QpVector::unit(runtime.instance.num_var,
    // rowindex_p)); double computed_weight = new_ep.dot(new_ep);
    double new_weight_p_updated = weight_p / (t_p * t_p);

    // if (fabs(updated_weight - computed_weight) > 1e-4) {
    //   printf("updated weight %lf vs computed weight %lf. aq[p] = %lf\n",
    //   updated_weight, computed_weight, t_p); printf("old weight = %lf, aq[p]
    //   = %lf, ^2 = %lf, new weight = %lf\n", weight_p, t_p, t_p*t_p,
    //   updated_weight);
    // }
    weights[rowindex_p] = new_weight_p_updated;
  }